

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

int sha3_384_init(hash_state *md)

{
  void *in_RDI;
  
  if (in_RDI == (void *)0x0) {
    fprintf(_stderr,"\nwarning: ARGCHK failed at %s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/sha3.c",0x9d)
    ;
  }
  memset(in_RDI,0,0x1a0);
  *(undefined2 *)((long)in_RDI + 0x19c) = 0xc;
  return 0;
}

Assistant:

int sha3_384_init(hash_state *md)
{
   LTC_ARGCHK(md != NULL);
   XMEMSET(&md->sha3, 0, sizeof(md->sha3));
   md->sha3.capacity_words = 2 * 384 / (8 * sizeof(ulong64));
   return CRYPT_OK;
}